

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

char * rw::Image::getFilename(char *name)

{
  FILE *__stream;
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  char *__s;
  long lVar7;
  int iVar8;
  Error _e;
  Error local_38;
  
  lVar6 = engine;
  lVar7 = (long)imageModuleOffset;
  sVar2 = strlen(name);
  iVar1 = *(int *)(lVar6 + 8 + lVar7);
  if (iVar1 == 0) {
    pcVar4 = strdup_LOC(name,0x30000,
                        "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/image.cpp line: 938"
                       );
    makePath(pcVar4);
    lVar6 = (**(code **)(engine + 0x20))(pcVar4,"rb");
    if (lVar6 != 0) {
      (**(code **)(engine + 0x28))(lVar6);
      name = pcVar4;
LAB_0010b2a4:
      printf("found %s\n",name);
      return pcVar4;
    }
    (*DAT_00144da0)(pcVar4);
  }
  else {
    __s = *(char **)(lVar6 + lVar7);
    for (iVar8 = 0; iVar8 < iVar1; iVar8 = iVar8 + 1) {
      sVar3 = strlen(__s);
      allocLocation =
           "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/image.cpp line: 950"
      ;
      pcVar4 = (char *)(*Engine::memfuncs)(sVar3 + sVar2 + 1,0x30018);
      if (pcVar4 == (char *)0x0) {
        local_38.plugin = 0x18;
        local_38.code = 0x80000002;
        fprintf(_stderr,"%s:%d: ",
                "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/image.cpp",0x3b8)
        ;
        __stream = _stderr;
        sVar3 = strlen(__s);
        pcVar4 = dbgsprint(0x80000002,sVar2 + 1 + sVar3);
        fprintf(__stream,"%s\n",pcVar4);
        setError(&local_38);
        return (char *)0x0;
      }
      strcpy(pcVar4,__s);
      strcat(pcVar4,name);
      makePath(pcVar4);
      lVar5 = (**(code **)(engine + 0x20))(pcVar4,"r");
      if (lVar5 != 0) {
        (**(code **)(engine + 0x28))(lVar5);
        goto LAB_0010b2a4;
      }
      (*DAT_00144da0)(pcVar4);
      sVar3 = strlen(__s);
      __s = __s + sVar3 + 1;
      iVar1 = *(int *)(lVar6 + 8 + lVar7);
    }
  }
  return (char *)0x0;
}

Assistant:

char*
Image::getFilename(const char *name)
{
	ImageGlobals *g = PLUGINOFFSET(ImageGlobals, engine, imageModuleOffset);
	void *f;
	char *s, *p = g->searchPaths;
	size_t len = strlen(name)+1;
	if(g->numSearchPaths == 0){
		s = rwStrdup(name, MEMDUR_EVENT);
		makePath(s);
		f = engine->filefuncs.rwfopen(s, "rb");
		if(f){
			engine->filefuncs.rwfclose(f);
			printf("found %s\n", s);
			return s;
		}
		rwFree(s);
		return nil;
	}else
		for(int i = 0; i < g->numSearchPaths; i++){
			s = (char*)rwMalloc(strlen(p)+len, MEMDUR_EVENT | ID_IMAGE);
			if(s == nil){
				RWERROR((ERR_ALLOC, strlen(p)+len));
				return nil;
			}
			strcpy(s, p);
			strcat(s, name);
			makePath(s);
			f = engine->filefuncs.rwfopen(s, "r");
			if(f){
				engine->filefuncs.rwfclose(f);
				printf("found %s\n", name);
				return s;
			}
			rwFree(s);
			p += strlen(p) + 1;
		}
	return nil;
}